

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall choc::value::Value::Value(Value *this,string_view s)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  char *__s;
  int *piVar2;
  pointer pcVar3;
  iterator __position;
  undefined8 __ptr;
  Allocator *pAVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  const_iterator __begin2;
  char *__args;
  size_type __rlen;
  size_t __n;
  Type local_50;
  
  __args = s._M_str;
  __n = s._M_len;
  local_50.mainType = string;
  local_50.content.object = (Object *)0x0;
  local_50.allocator = (Allocator *)0x0;
  Value(this,&local_50);
  pAVar4 = local_50.allocator;
  __ptr = local_50.content.object;
  if ((char)local_50.mainType < '\0') {
    if (local_50.mainType == object) {
      if (local_50.content.object == (Object *)0x0) goto LAB_001ca7a1;
      Type::Object::~Object(local_50.content.object);
    }
    else {
      if ((local_50.mainType != complexArray) || (local_50.content.object == (Object *)0x0))
      goto LAB_001ca7a1;
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_50.content.object);
    }
    if (pAVar4 == (Allocator *)0x0) {
      free((void *)__ptr);
    }
    else {
      (**(code **)(*(long *)pAVar4 + 0x20))(pAVar4,__ptr);
    }
  }
LAB_001ca7a1:
  piVar2 = (int *)(this->value).data;
  if (__n == 0) {
    iVar5 = 0;
  }
  else {
    pcVar3 = (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pcVar3;
    if (uVar8 != 0) {
      uVar7 = 0;
      do {
        __s = pcVar3 + uVar7;
        sVar6 = strlen(__s);
        if (sVar6 == __n) {
          iVar5 = bcmp(__args,__s,__n);
          if (iVar5 == 0) {
            iVar5 = (int)uVar7;
            goto LAB_001ca896;
          }
        }
        uVar7 = uVar7 + sVar6 + 1;
      } while (uVar7 < uVar8);
    }
    this_00 = &(this->dictionary).strings;
    std::vector<char,_std::allocator<char>_>::reserve(this_00,__n + uVar8 + 1);
    iVar5 = (int)uVar8;
    do {
      __position._M_current =
           (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)this_00,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        ppcVar1 = &(this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      __args = __args + 1;
      __n = __n - 1;
    } while (__n != 0);
    local_50.mainType = void_;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,(char *)&local_50);
LAB_001ca896:
    iVar5 = iVar5 + 1;
  }
  *piVar2 = iVar5;
  return;
}

Assistant:

inline Value::Value (std::string_view s)  : Value (Type::createString())   { writeUnaligned (value.data, dictionary.getHandleForString (s)); }